

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O0

void de::cmdline::detail::dispatchSetDefault<tcu::opt::StdinCaseList>(TypedFieldMap *dst)

{
  bool *dst_00;
  ValueType *value;
  TypedFieldMap *dst_local;
  
  dst_00 = (bool *)operator_new(1);
  *dst_00 = false;
  getTypeDefault<bool>(dst_00);
  TypedFieldMap::set<tcu::opt::StdinCaseList>(dst,dst_00);
  return;
}

Assistant:

void dispatchSetDefault (TypedFieldMap* dst)
{
	typename OptTraits<OptType>::ValueType* value = new typename OptTraits<OptType>::ValueType();
	try
	{
		getTypeDefault<typename OptTraits<OptType>::ValueType>(value);
		dst->set<OptType>(value);
	}
	catch (...)
	{
		delete value;
		throw;
	}
}